

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,cmLocalUnixMakefileGenerator3 *lg)

{
  pointer *this_00;
  bool bVar1;
  TargetType TVar2;
  GeneratorTargetVector *this_01;
  reference this_02;
  pointer pcVar3;
  string *psVar4;
  ulong uVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  reference puVar8;
  cmake *this_03;
  cmState *this_04;
  size_t sVar9;
  string_view sVar10;
  string local_c50;
  cmAlphaNum local_c30;
  cmAlphaNum local_c00;
  string local_bd0;
  string local_bb0;
  string local_b90;
  cmAlphaNum local_b70;
  string local_b40;
  cmAlphaNum local_b20;
  string local_af0;
  string local_ad0;
  cmAlphaNum local_ab0;
  string local_a80;
  cmAlphaNum local_a60;
  string local_a30;
  value_type local_a10;
  string_view local_9f0;
  string local_9e0;
  undefined1 local_9c0 [8];
  ostringstream progCmd_1;
  string local_848;
  allocator<char> local_821;
  undefined1 local_820 [8];
  string tmp;
  undefined1 local_7e0 [8];
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  string local_7a0;
  undefined1 local_780 [8];
  ostringstream progCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string_view local_5e8;
  allocator<char> local_5d1;
  string local_5d0;
  cmValue local_5b0;
  cmValue tgtMsg;
  string local_5a0 [7];
  bool targetMessages;
  ulong local_580;
  unsigned_long progFile;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  char *sep;
  ostringstream progressArg;
  cmAlphaNum local_3d8;
  cmAlphaNum local_3a8;
  string local_378;
  undefined1 local_358 [8];
  EchoProgress progress;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  string local_298;
  string local_278;
  cmAlphaNum local_258;
  cmAlphaNum local_228;
  string local_1f8;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a8;
  string local_178;
  string local_158;
  undefined1 local_138 [8];
  string makefileName;
  string name;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gtarget;
  const_iterator __end1;
  const_iterator __begin1;
  GeneratorTargetVector *__range1;
  allocator<char> local_c1;
  string local_c0;
  byte local_99;
  undefined1 local_98 [7];
  bool regenerate;
  string makeTargetName;
  string localName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmLocalUnixMakefileGenerator3 *lg_local;
  cmLocalUnixMakefileGenerator3 *rootLG_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&localName.field_2 + 8));
  std::__cxx11::string::string((string *)(makeTargetName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_SUPPRESS_REGENERATION",&local_c1);
  bVar1 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_99 = (bVar1 ^ 0xffU) & 1;
  if (local_99 != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char (*) [25])"cmake_check_build_system");
  }
  this_01 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)lg);
  __end1 = std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::begin(this_01);
  gtarget = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
            std::
            vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
            ::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                *)&gtarget);
    if (!bVar1) break;
    this_02 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
              ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::operator->
                       (this_02);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    std::__cxx11::string::string((string *)(makefileName.field_2._M_local_buf + 8),(string *)psVar4)
    ;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_02);
      bVar1 = cmGeneratorTarget::IsInBuildSystem(pcVar3);
      if (bVar1) {
        pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->(this_02);
        TVar2 = cmGeneratorTarget::GetType(pcVar3);
        if (TVar2 != GLOBAL_TARGET) {
          std::__cxx11::string::string((string *)local_138);
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (this_02);
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&local_158,lg,pcVar3)
          ;
          std::__cxx11::string::operator=
                    ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          cmAlphaNum::cmAlphaNum(&local_1a8,(string *)(makeTargetName.field_2._M_local_buf + 8));
          cmAlphaNum::cmAlphaNum(&local_1d8,"/build.make");
          cmStrCat<>(&local_178,&local_1a8,&local_1d8);
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
          poVar6 = std::operator<<(ruleFileStream,"# Target rules for target ");
          poVar6 = std::operator<<(poVar6,(string *)(makeTargetName.field_2._M_local_buf + 8));
          std::operator<<(poVar6,"\n\n");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8));
          cmAlphaNum::cmAlphaNum(&local_228,(string *)((long)&makeTargetName.field_2 + 8));
          cmAlphaNum::cmAlphaNum(&local_258,"/depend");
          cmStrCat<>(&local_1f8,&local_228,&local_258);
          std::__cxx11::string::operator=((string *)local_98,(string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    (&local_278,lg,(string *)local_138,(string *)local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          cmAlphaNum::cmAlphaNum(&local_2c8,(string *)((long)&makeTargetName.field_2 + 8));
          cmAlphaNum::cmAlphaNum(&local_2f8,"/build");
          cmStrCat<>(&local_298,&local_2c8,&local_2f8);
          std::__cxx11::string::operator=((string *)local_98,(string *)&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)((long)&progress.Arg.field_2 + 8),lg,(string *)local_138,
                     (string *)local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),
                      (value_type *)((long)&progress.Arg.field_2 + 8));
          std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=
                    ((string *)(makeTargetName.field_2._M_local_buf + 8),"/all");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress((EchoProgress *)local_358);
          psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
          cmAlphaNum::cmAlphaNum(&local_3a8,psVar4);
          cmAlphaNum::cmAlphaNum(&local_3d8,"/CMakeFiles");
          cmStrCat<>(&local_378,&local_3a8,&local_3d8);
          std::__cxx11::string::operator=((string *)local_358,(string *)&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
          __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe2f737;
          __begin3._M_current =
               (unsigned_long *)
               std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                         (this_02);
          pmVar7 = std::
                   map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                   ::operator[](&this->ProgressMap,(key_type *)&__begin3);
          __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&pmVar7->Marks)
          ;
          progFile = (unsigned_long)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&pmVar7->Marks)
          ;
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        *)&progFile);
            if (!bVar1) break;
            puVar8 = __gnu_cxx::
                     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::operator*(&__end3);
            local_580 = *puVar8;
            poVar6 = std::operator<<((ostream *)&sep,(char *)__range3);
            std::ostream::operator<<(poVar6,local_580);
            __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd9e78d;
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end3);
          }
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=
                    ((string *)(progress.Dir.field_2._M_local_buf + 8),local_5a0);
          std::__cxx11::string::~string(local_5a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
          tgtMsg.Value._7_1_ = 1;
          this_03 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
          this_04 = cmake::GetState(this_03);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5d0,"TARGET_MESSAGES",&local_5d1);
          local_5b0 = cmState::GetGlobalProperty(this_04,&local_5d0);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::allocator<char>::~allocator(&local_5d1);
          bVar1 = cmValue::operator_cast_to_bool(&local_5b0);
          if (bVar1) {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_5b0);
            sVar10 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
            local_5e8 = sVar10;
            tgtMsg.Value._7_1_ = cmIsOn(sVar10);
          }
          if ((tgtMsg.Value._7_1_ & 1) != 0) {
            std::operator+(&local_608,"Built target ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&makefileName.field_2 + 8));
            cmLocalUnixMakefileGenerator3::AppendEcho
                      (lg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&localName.field_2 + 8),&local_608,EchoNormal,
                       (EchoProgress *)local_358);
            std::__cxx11::string::~string((string *)&local_608);
          }
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (this_02);
          AppendGlobalTargetDepends
                    (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&commands.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar3);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"All Build rule for target.",
                     (string *)((long)&makeTargetName.field_2 + 8),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&localName.field_2 + 8),true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8));
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
          std::operator<<((ostream *)local_780,"$(CMAKE_COMMAND) -E cmake_progress_start ");
          sVar10 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_358);
          emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar10._M_len;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_7a0,
                     &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,sVar10,SHELL);
          std::operator<<((ostream *)local_780,(string *)&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)local_7e0);
          poVar6 = std::operator<<((ostream *)local_780," ");
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (this_02);
          sVar9 = CountProgressMarksInTarget
                            (this,pcVar3,
                             (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                              *)local_7e0);
          std::ostream::operator<<(poVar6,sVar9);
          std::__cxx11::ostringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),(value_type *)((long)&tmp.field_2 + 8));
          std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
          std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)local_7e0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_820,"CMakeFiles/Makefile2",&local_821);
          std::allocator<char>::~allocator(&local_821);
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    (&local_848,lg,(string *)local_820,(string *)((long)&makeTargetName.field_2 + 8)
                    );
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),&local_848);
          std::__cxx11::string::~string((string *)&local_848);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9c0);
          std::operator<<((ostream *)local_9c0,"$(CMAKE_COMMAND) -E cmake_progress_start ");
          sVar10 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_358);
          local_9f0 = sVar10;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_9e0,
                     &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,sVar10,SHELL);
          std::operator<<((ostream *)local_9c0,(string *)&local_9e0);
          std::__cxx11::string::~string((string *)&local_9e0);
          std::operator<<((ostream *)local_9c0," 0");
          std::__cxx11::ostringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),&local_a10);
          std::__cxx11::string::~string((string *)&local_a10);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((local_99 & 1) != 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[25]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (char (*) [25])"cmake_check_build_system");
          }
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (this_02);
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&local_a80,lg,pcVar3)
          ;
          cmAlphaNum::cmAlphaNum(&local_a60,&local_a80);
          cmAlphaNum::cmAlphaNum(&local_ab0,"/rule");
          cmStrCat<>(&local_a30,&local_a60,&local_ab0);
          std::__cxx11::string::operator=
                    ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_a30);
          std::__cxx11::string::~string((string *)&local_a30);
          std::__cxx11::string::~string((string *)&local_a80);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"Build rule for subdir invocation for target.",
                     (string *)(makeTargetName.field_2._M_local_buf + 8),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&localName.field_2 + 8),true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8));
          this_00 = &commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00,(value_type *)((long)&makeTargetName.field_2 + 8));
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"Convenience name for target.",
                     (string *)((long)&makefileName.field_2 + 8),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&localName.field_2 + 8),true,false);
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->(this_02);
          cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_(&local_ad0,lg);
          bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(pcVar3,&local_ad0);
          std::__cxx11::string::~string((string *)&local_ad0);
          if (bVar1) {
            pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     get(this_02);
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_b40,lg,pcVar3);
            cmAlphaNum::cmAlphaNum(&local_b20,&local_b40);
            cmAlphaNum::cmAlphaNum(&local_b70,"/preinstall");
            cmStrCat<>(&local_af0,&local_b20,&local_b70);
            std::__cxx11::string::operator=
                      ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_af0);
            std::__cxx11::string::~string((string *)&local_af0);
            std::__cxx11::string::~string((string *)&local_b40);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&localName.field_2 + 8));
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      (&local_b90,lg,(string *)local_138,
                       (string *)(makeTargetName.field_2._M_local_buf + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&localName.field_2 + 8),&local_b90);
            std::__cxx11::string::~string((string *)&local_b90);
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"Pre-install relink rule for target.",
                       (string *)((long)&makeTargetName.field_2 + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&commands.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&localName.field_2 + 8),true,false);
          }
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (this_02);
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&local_bb0,lg,pcVar3)
          ;
          std::__cxx11::string::operator=
                    ((string *)(makeTargetName.field_2._M_local_buf + 8),(string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_bb0);
          cmAlphaNum::cmAlphaNum(&local_c00,(string *)(makeTargetName.field_2._M_local_buf + 8));
          cmAlphaNum::cmAlphaNum(&local_c30,"/clean");
          cmStrCat<>(&local_bd0,&local_c00,&local_c30);
          std::__cxx11::string::operator=((string *)local_98,(string *)&local_bd0);
          std::__cxx11::string::~string((string *)&local_bd0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8));
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    (&local_c50,lg,(string *)local_138,(string *)local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&localName.field_2 + 8),&local_c50);
          std::__cxx11::string::~string((string *)&local_c50);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (rootLG,ruleFileStream,"clean rule for target.",(string *)local_98,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&localName.field_2 + 8),true,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&localName.field_2 + 8));
          std::__cxx11::string::~string((string *)local_820);
          cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress((EchoProgress *)local_358);
          std::__cxx11::string::~string((string *)local_138);
        }
      }
    }
    std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(makeTargetName.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&localName.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  cmLocalUnixMakefileGenerator3& lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // for each target Generate the rule files for each target.
  for (const auto& gtarget : lg.GetGeneratorTargets()) {
    std::string name = gtarget->GetName();
    if (!name.empty() &&
        (gtarget->IsInBuildSystem() &&
         gtarget->GetType() != cmStateEnums::GLOBAL_TARGET)) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makefileName = cmStrCat(localName, "/build.make");

      lg.WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = cmStrCat(localName, "/depend");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      makeTargetName = cmStrCat(localName, "/build");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = cmStrCat(lg.GetBinaryDirectory(), "/CMakeFiles");
      {
        std::ostringstream progressArg;
        const char* sep = "";
        for (unsigned long progFile : this->ProgressMap[gtarget.get()].Marks) {
          progressArg << sep << progFile;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (cmValue tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = cmIsOn(*tgtMsg);
      }

      if (targetMessages) {
        lg.AppendEcho(commands, "Built target " + name,
                      cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget.get());
      rootLG.WriteMakeRule(ruleFileStream, "All Build rule for target.",
                           localName, depends, commands, true);

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " "
                << this->CountProgressMarksInTarget(gtarget.get(), emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = "CMakeFiles/Makefile2";
      commands.push_back(lg.GetRecursiveMakeCall(tmp, localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      if (regenerate) {
        depends.emplace_back("cmake_check_build_system");
      }
      localName =
        cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()), "/rule");
      rootLG.WriteMakeRule(ruleFileStream,
                           "Build rule for subdir invocation for target.",
                           localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      rootLG.WriteMakeRule(ruleFileStream, "Convenience name for target.",
                           name, depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg.GetConfigName())) {
        localName = cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()),
                             "/preinstall");
        depends.clear();
        commands.clear();
        commands.push_back(lg.GetRecursiveMakeCall(makefileName, localName));
        rootLG.WriteMakeRule(ruleFileStream,
                             "Pre-install relink rule for target.", localName,
                             depends, commands, true);
      }

      // add the clean rule
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makeTargetName = cmStrCat(localName, "/clean");
      depends.clear();
      commands.clear();
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));
      rootLG.WriteMakeRule(ruleFileStream, "clean rule for target.",
                           makeTargetName, depends, commands, true);
      commands.clear();
    }
  }
}